

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void open_file_endpoint(connection *conn,char *path,file_stat_t *st,char *extra_headers)

{
  uint uVar1;
  int64_t iVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *local_5f8;
  long local_598;
  long local_590;
  undefined1 auStack_580 [4];
  int n;
  vec mime_vec;
  int64_t r2;
  int64_t r1;
  time_t curtime;
  char *hdr;
  char *msg;
  char headers [1000];
  char local_158 [8];
  char range [64];
  char etag [64];
  char lm [64];
  char date [64];
  char *extra_headers_local;
  file_stat_t *st_local;
  char *path_local;
  connection *conn_local;
  
  hdr = "OK";
  r1 = time((time_t *)0x0);
  conn->endpoint_type = EP_FILE;
  ns_set_close_on_exec((conn->endpoint).fd);
  (conn->mg_conn).status_code = 200;
  get_mime_type(conn->server,path,(vec *)auStack_580);
  conn->cl = st->st_size;
  local_158[0] = '\0';
  mime_vec.len = 0;
  mime_vec._12_4_ = 0;
  r2 = 0;
  curtime = (time_t)mg_get_header(&conn->mg_conn,"Range");
  if (((((char *)curtime != (char *)0x0) &&
       (iVar4 = parse_range_header((char *)curtime,&r2,(int64_t *)&mime_vec.len), 0 < iVar4)) &&
      (-1 < r2)) && (-1 < (long)mime_vec._8_8_)) {
    (conn->mg_conn).status_code = 0xce;
    if (iVar4 == 2) {
      if (conn->cl < (long)mime_vec._8_8_) {
        local_590 = conn->cl;
      }
      else {
        local_590 = mime_vec._8_8_;
      }
      local_598 = (local_590 - r2) + 1;
    }
    else {
      local_598 = conn->cl - r2;
    }
    conn->cl = local_598;
    mg_snprintf(local_158,0x40,"Content-Range: bytes %ld-%ld/%ld\r\n",r2,r2 + conn->cl + -1,
                st->st_size);
    hdr = "Partial Content";
    lseek64((conn->endpoint).fd,r2,0);
  }
  gmt_time_string(lm + 0x38,0x40,&r1);
  gmt_time_string(etag + 0x38,0x40,&st->st_mtime);
  construct_etag(range + 0x38,0x40,st);
  pcVar3 = hdr;
  uVar1 = (conn->mg_conn).status_code;
  iVar2 = conn->cl;
  pcVar5 = suggest_connection_header(&conn->mg_conn);
  local_5f8 = extra_headers;
  if (extra_headers == (char *)0x0) {
    local_5f8 = "";
  }
  iVar4 = mg_snprintf((char *)&msg,1000,
                      "HTTP/1.1 %d %s\r\nDate: %s\r\nLast-Modified: %s\r\nEtag: %s\r\nContent-Type: %.*s\r\nContent-Length: %ld\r\nConnection: %s\r\nAccept-Ranges: bytes\r\n%s%s%s\r\n"
                      ,(ulong)uVar1,pcVar3,lm + 0x38,etag + 0x38,range + 0x38,mime_vec.ptr._0_4_,
                      _auStack_580,iVar2,pcVar5,local_158,local_5f8,"");
  ns_send(conn->ns_conn,&msg,iVar4);
  iVar4 = strcmp((conn->mg_conn).request_method,"HEAD");
  if (iVar4 == 0) {
    conn->ns_conn->flags = conn->ns_conn->flags | 1;
    close((conn->endpoint).fd);
    conn->endpoint_type = EP_NONE;
  }
  return;
}

Assistant:

static void open_file_endpoint(struct connection *conn, const char *path,
                               file_stat_t *st, const char *extra_headers) {
  char date[64], lm[64], etag[64], range[64], headers[1000];
  const char *msg = "OK", *hdr;
  time_t curtime = time(NULL);
  int64_t r1, r2;
  struct vec mime_vec;
  int n;

  conn->endpoint_type = EP_FILE;
  ns_set_close_on_exec(conn->endpoint.fd);
  conn->mg_conn.status_code = 200;

  get_mime_type(conn->server, path, &mime_vec);
  conn->cl = st->st_size;
  range[0] = '\0';

  // If Range: header specified, act accordingly
  r1 = r2 = 0;
  hdr = mg_get_header(&conn->mg_conn, "Range");
  if (hdr != NULL && (n = parse_range_header(hdr, &r1, &r2)) > 0 &&
      r1 >= 0 && r2 >= 0) {
    conn->mg_conn.status_code = 206;
    conn->cl = n == 2 ? (r2 > conn->cl ? conn->cl : r2) - r1 + 1: conn->cl - r1;
    mg_snprintf(range, sizeof(range), "Content-Range: bytes "
                "%" INT64_FMT "-%" INT64_FMT "/%" INT64_FMT "\r\n",
                r1, r1 + conn->cl - 1, (int64_t) st->st_size);
    msg = "Partial Content";
    lseek(conn->endpoint.fd, r1, SEEK_SET);
  }

  // Prepare Etag, Date, Last-Modified headers. Must be in UTC, according to
  // http://www.w3.org/Protocols/rfc2616/rfc2616-sec3.html#sec3.3
  gmt_time_string(date, sizeof(date), &curtime);
  gmt_time_string(lm, sizeof(lm), &st->st_mtime);
  construct_etag(etag, sizeof(etag), st);

  n = mg_snprintf(headers, sizeof(headers),
                  "HTTP/1.1 %d %s\r\n"
                  "Date: %s\r\n"
                  "Last-Modified: %s\r\n"
                  "Etag: %s\r\n"
                  "Content-Type: %.*s\r\n"
                  "Content-Length: %" INT64_FMT "\r\n"
                  "Connection: %s\r\n"
                  "Accept-Ranges: bytes\r\n"
                  "%s%s%s\r\n",
                  conn->mg_conn.status_code, msg, date, lm, etag,
                  (int) mime_vec.len, mime_vec.ptr, conn->cl,
                  suggest_connection_header(&conn->mg_conn),
                  range, extra_headers == NULL ? "" : extra_headers,
                  MONGOOSE_USE_EXTRA_HTTP_HEADERS);
  ns_send(conn->ns_conn, headers, n);

  if (!strcmp(conn->mg_conn.request_method, "HEAD")) {
    conn->ns_conn->flags |= NSF_FINISHED_SENDING_DATA;
    close(conn->endpoint.fd);
    conn->endpoint_type = EP_NONE;
  }
}